

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_write_new_session_ticket(mbedtls_ssl_context *ssl)

{
  uint32_t local_2c;
  size_t sStack_28;
  uint32_t lifetime;
  size_t tlen;
  mbedtls_ssl_context *pmStack_18;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  pmStack_18 = ssl;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,0xe9e,"=> write new session ticket");
  pmStack_18->out_msgtype = 0x16;
  *pmStack_18->out_msg = '\x04';
  tlen._4_4_ = (*pmStack_18->conf->f_ticket_write)
                         (pmStack_18->conf->p_ticket,pmStack_18->session_negotiate,
                          pmStack_18->out_msg + 10,pmStack_18->out_msg + 0x4000,
                          &stack0xffffffffffffffd8,&local_2c);
  if (tlen._4_4_ != 0) {
    mbedtls_debug_print_ret
              (pmStack_18,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xeb4,"mbedtls_ssl_ticket_write",tlen._4_4_);
    sStack_28 = 0;
  }
  pmStack_18->out_msg[4] = (uchar)(local_2c >> 0x18);
  pmStack_18->out_msg[5] = (uchar)(local_2c >> 0x10);
  pmStack_18->out_msg[6] = (uchar)(local_2c >> 8);
  pmStack_18->out_msg[7] = (uchar)local_2c;
  pmStack_18->out_msg[8] = (uchar)(sStack_28 >> 8);
  pmStack_18->out_msg[9] = (uchar)sStack_28;
  pmStack_18->out_msglen = sStack_28 + 10;
  pmStack_18->handshake->new_session_ticket = 0;
  tlen._4_4_ = mbedtls_ssl_write_record(pmStack_18);
  if (tlen._4_4_ == 0) {
    mbedtls_debug_print_msg
              (pmStack_18,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xece,"<= write new session ticket");
    ssl_local._4_4_ = 0;
  }
  else {
    mbedtls_debug_print_ret
              (pmStack_18,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xeca,"mbedtls_ssl_write_record",tlen._4_4_);
    ssl_local._4_4_ = tlen._4_4_;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_write_new_session_ticket( mbedtls_ssl_context *ssl )
{
    int ret;
    size_t tlen;
    uint32_t lifetime;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write new session ticket" ) );

    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_NEW_SESSION_TICKET;

    /*
     * struct {
     *     uint32 ticket_lifetime_hint;
     *     opaque ticket<0..2^16-1>;
     * } NewSessionTicket;
     *
     * 4  .  7   ticket_lifetime_hint (0 = unspecified)
     * 8  .  9   ticket_len (n)
     * 10 .  9+n ticket content
     */

    if( ( ret = ssl->conf->f_ticket_write( ssl->conf->p_ticket,
                                ssl->session_negotiate,
                                ssl->out_msg + 10,
                                ssl->out_msg + MBEDTLS_SSL_MAX_CONTENT_LEN,
                                &tlen, &lifetime ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_ticket_write", ret );
        tlen = 0;
    }

    ssl->out_msg[4] = ( lifetime >> 24 ) & 0xFF;
    ssl->out_msg[5] = ( lifetime >> 16 ) & 0xFF;
    ssl->out_msg[6] = ( lifetime >>  8 ) & 0xFF;
    ssl->out_msg[7] = ( lifetime       ) & 0xFF;

    ssl->out_msg[8] = (unsigned char)( ( tlen >> 8 ) & 0xFF );
    ssl->out_msg[9] = (unsigned char)( ( tlen      ) & 0xFF );

    ssl->out_msglen = 10 + tlen;

    /*
     * Morally equivalent to updating ssl->state, but NewSessionTicket and
     * ChangeCipherSpec share the same state.
     */
    ssl->handshake->new_session_ticket = 0;

    if( ( ret = mbedtls_ssl_write_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_write_record", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write new session ticket" ) );

    return( 0 );
}